

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall
QMessageBoxPrivate::helperPrepareShow(QMessageBoxPrivate *this,QPlatformDialogHelper *param_2)

{
  bool bVar1;
  Icon i;
  ButtonRole BVar2;
  QMessageDialogOptions *pQVar3;
  QMessageDialogOptions *pQVar4;
  QMessageDialogOptions *pQVar5;
  QPushButton *pQVar6;
  QPlatformTheme *pQVar7;
  QAbstractButton **ppQVar8;
  QMessageBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  int buttonId;
  ButtonRole buttonRole_1;
  QAbstractButton *customButton;
  QList<QAbstractButton_*> *__range1;
  ButtonRole buttonRole;
  QPlatformTheme *platformTheme;
  QPushButton *standardButton;
  int button;
  QMessageBox *q;
  iterator __end1;
  iterator __begin1;
  StandardButtons standardButtons;
  QCheckBox *in_stack_fffffffffffffe28;
  QMessageBox *in_stack_fffffffffffffe30;
  QWidget *in_stack_fffffffffffffe38;
  QMessageDialogOptions *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  byte in_stack_fffffffffffffe57;
  uint local_13c;
  undefined1 local_120 [24];
  undefined1 local_108 [24];
  QAbstractButton **local_f0;
  iterator local_e8;
  iterator local_e0;
  Int local_d4;
  undefined1 local_d0 [24];
  undefined1 local_b8 [52];
  QFlagsStorage<QPlatformDialogHelper::StandardButton> local_84;
  QPixmap local_80 [120];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  pQVar3 = QSharedPointer<QMessageDialogOptions>::operator->
                     ((QSharedPointer<QMessageDialogOptions> *)0x7a8ec7);
  QWidget::windowTitle(in_stack_fffffffffffffe38);
  QMessageDialogOptions::setWindowTitle((QString *)pQVar3);
  QString::~QString((QString *)0x7a8f00);
  pQVar4 = QSharedPointer<QMessageDialogOptions>::operator->
                     ((QSharedPointer<QMessageDialogOptions> *)0x7a8f11);
  QMessageBox::text((QMessageBox *)in_stack_fffffffffffffe38);
  QMessageDialogOptions::setText((QString *)pQVar4);
  QString::~QString((QString *)0x7a8f4a);
  pQVar4 = QSharedPointer<QMessageDialogOptions>::operator->
                     ((QSharedPointer<QMessageDialogOptions> *)0x7a8f5b);
  QMessageBox::informativeText((QMessageBox *)in_stack_fffffffffffffe38);
  QMessageDialogOptions::setInformativeText((QString *)pQVar4);
  QString::~QString((QString *)0x7a8f94);
  pQVar5 = QSharedPointer<QMessageDialogOptions>::operator->
                     ((QSharedPointer<QMessageDialogOptions> *)0x7a8fa5);
  QMessageBox::detailedText((QMessageBox *)in_stack_fffffffffffffe38);
  QMessageDialogOptions::setDetailedText((QString *)pQVar5);
  QString::~QString((QString *)0x7a8fde);
  pQVar5 = QSharedPointer<QMessageDialogOptions>::operator->
                     ((QSharedPointer<QMessageDialogOptions> *)0x7a8fef);
  i = QMessageBox::icon(in_stack_fffffffffffffe30);
  helperIcon(i);
  QMessageDialogOptions::setStandardIcon((StandardIcon)pQVar5);
  pQVar5 = QSharedPointer<QMessageDialogOptions>::operator->
                     ((QSharedPointer<QMessageDialogOptions> *)0x7a9025);
  QMessageBox::iconPixmap((QMessageBox *)in_stack_fffffffffffffe38);
  QMessageDialogOptions::setIconPixmap((QPixmap *)pQVar5);
  QPixmap::~QPixmap(local_80);
  QSharedPointer<QMessageDialogOptions>::operator->
            ((QSharedPointer<QMessageDialogOptions> *)0x7a906f);
  QMessageDialogOptions::clearCustomButtons();
  local_84.i = 0xaaaaaaaa;
  local_84.i = (Int)helperStandardButtons((QMessageBox *)in_stack_fffffffffffffe28);
  for (local_13c = 0x400; (int)local_13c < 0x8000001; local_13c = local_13c << 1) {
    pQVar6 = QDialogButtonBox::button
                       ((QDialogButtonBox *)
                        CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                        (StandardButton)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    if (pQVar6 != (QPushButton *)0x0) {
      pQVar7 = QGuiApplicationPrivate::platformTheme();
      if (pQVar7 != (QPlatformTheme *)0x0) {
        QAbstractButton::text((QAbstractButton *)in_stack_fffffffffffffe38);
        (**(code **)(*(long *)pQVar7 + 0x88))(local_b8,pQVar7,local_13c);
        in_stack_fffffffffffffe57 =
             ::operator!=((QString *)in_stack_fffffffffffffe30,(QString *)in_stack_fffffffffffffe28)
        ;
        QString::~QString((QString *)0x7a915b);
        QString::~QString((QString *)0x7a9168);
        if ((in_stack_fffffffffffffe57 & 1) != 0) {
          BVar2 = QDialogButtonBox::buttonRole((QDialogButtonBox *)pQVar3,(QAbstractButton *)pQVar4)
          ;
          in_stack_fffffffffffffe48 =
               QSharedPointer<QMessageDialogOptions>::operator->
                         ((QSharedPointer<QMessageDialogOptions> *)0x7a91a6);
          QAbstractButton::text((QAbstractButton *)in_stack_fffffffffffffe38);
          QMessageDialogOptions::addButton
                    ((QString *)in_stack_fffffffffffffe48,(ButtonRole)local_d0,
                     (void *)(ulong)(uint)BVar2,(int)pQVar6);
          QString::~QString((QString *)0x7a91f6);
          QFlags<QPlatformDialogHelper::StandardButton>::operator&=
                    ((QFlags<QPlatformDialogHelper::StandardButton> *)&local_84,
                     local_13c ^ 0xffffffff);
        }
      }
      if (pQVar6 == in_RDI->defaultButton) {
        pQVar5 = QSharedPointer<QMessageDialogOptions>::operator->
                           ((QSharedPointer<QMessageDialogOptions> *)0x7a9236);
        QMessageDialogOptions::setDefaultButton((int)pQVar5);
      }
      else if (pQVar6 == (QPushButton *)in_RDI->detectedEscapeButton) {
        pQVar5 = QSharedPointer<QMessageDialogOptions>::operator->
                           ((QSharedPointer<QMessageDialogOptions> *)0x7a926e);
        QMessageDialogOptions::setEscapeButton((int)pQVar5);
      }
    }
  }
  pQVar5 = QSharedPointer<QMessageDialogOptions>::operator->
                     ((QSharedPointer<QMessageDialogOptions> *)0x7a92a7);
  local_d4 = local_84.i;
  QMessageDialogOptions::setStandardButtons((QFlags_conflict1 *)pQVar5);
  local_e0.i = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  local_e0 = QList<QAbstractButton_*>::begin((QList<QAbstractButton_*> *)in_stack_fffffffffffffe30);
  local_e8.i = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  local_e8 = QList<QAbstractButton_*>::end((QList<QAbstractButton_*> *)in_stack_fffffffffffffe30);
  while( true ) {
    local_f0 = local_e8.i;
    bVar1 = QList<QAbstractButton_*>::iterator::operator!=(&local_e0,local_e8);
    if (!bVar1) break;
    ppQVar8 = QList<QAbstractButton_*>::iterator::operator*(&local_e0);
    pQVar6 = (QPushButton *)*ppQVar8;
    if (pQVar6 != &in_RDI->detailsButton->super_QPushButton) {
      BVar2 = QDialogButtonBox::buttonRole((QDialogButtonBox *)pQVar3,(QAbstractButton *)pQVar4);
      in_stack_fffffffffffffe38 =
           (QWidget *)
           QSharedPointer<QMessageDialogOptions>::operator->
                     ((QSharedPointer<QMessageDialogOptions> *)0x7a93ab);
      QAbstractButton::text((QAbstractButton *)in_stack_fffffffffffffe38);
      QMessageDialogOptions::addButton
                ((QString *)in_stack_fffffffffffffe38,(ButtonRole)local_108,
                 (void *)(ulong)(uint)BVar2,(int)pQVar6);
      QString::~QString((QString *)0x7a93f1);
      if (pQVar6 == in_RDI->defaultButton) {
        pQVar5 = QSharedPointer<QMessageDialogOptions>::operator->
                           ((QSharedPointer<QMessageDialogOptions> *)0x7a941d);
        QMessageDialogOptions::setDefaultButton((int)pQVar5);
      }
      else if (pQVar6 == (QPushButton *)in_RDI->detectedEscapeButton) {
        pQVar5 = QSharedPointer<QMessageDialogOptions>::operator->
                           ((QSharedPointer<QMessageDialogOptions> *)0x7a944f);
        QMessageDialogOptions::setEscapeButton((int)pQVar5);
      }
    }
    QList<QAbstractButton_*>::iterator::operator++(&local_e0);
  }
  if (in_RDI->checkbox != (QCheckBox *)0x0) {
    pQVar3 = QSharedPointer<QMessageDialogOptions>::operator->
                       ((QSharedPointer<QMessageDialogOptions> *)0x7a9491);
    QAbstractButton::text((QAbstractButton *)in_stack_fffffffffffffe38);
    QCheckBox::checkState(in_stack_fffffffffffffe28);
    QMessageDialogOptions::setCheckBox((QString *)pQVar3,(CheckState)local_120);
    QString::~QString((QString *)0x7a94e4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBoxPrivate::helperPrepareShow(QPlatformDialogHelper *)
{
    Q_Q(QMessageBox);
    options->setWindowTitle(q->windowTitle());
    options->setText(q->text());
    options->setInformativeText(q->informativeText());
#if QT_CONFIG(textedit)
    options->setDetailedText(q->detailedText());
#endif
    options->setStandardIcon(helperIcon(q->icon()));
    options->setIconPixmap(q->iconPixmap());

    // Clear up front, since we might have prepared earlier
    options->clearCustomButtons();

    // Add standard buttons and resolve default/escape button
    auto standardButtons = helperStandardButtons(q);
    for (int button = QDialogButtonBox::StandardButton::FirstButton;
             button <= QDialogButtonBox::StandardButton::LastButton; button <<= 1) {
        auto *standardButton = buttonBox->button(QDialogButtonBox::StandardButton(button));
        if (!standardButton)
            continue;

        if (auto *platformTheme = QGuiApplicationPrivate::platformTheme()) {
            if (standardButton->text() != platformTheme->standardButtonText(button)) {
                // The standard button has been customized, so add it as
                // a custom button instead.
                const auto buttonRole = buttonBox->buttonRole(standardButton);
                options->addButton(standardButton->text(),
                    static_cast<QPlatformDialogHelper::ButtonRole>(buttonRole),
                    standardButton, button);
                standardButtons &= ~QPlatformDialogHelper::StandardButton(button);
            }
        }

        if (standardButton == defaultButton)
            options->setDefaultButton(button);
        else if (standardButton == detectedEscapeButton)
            options->setEscapeButton(button);
    }
    options->setStandardButtons(standardButtons);

    // Add custom buttons and resolve default/escape button
    for (auto *customButton : customButtonList) {
        // Unless it's the details button, since we don't do any
        // plumbing for the button's action in that case.
        if (customButton == detailsButton)
            continue;

        const auto buttonRole = buttonBox->buttonRole(customButton);
        const int buttonId = options->addButton(customButton->text(),
            static_cast<QPlatformDialogHelper::ButtonRole>(buttonRole),
            customButton);

        if (customButton == defaultButton)
            options->setDefaultButton(buttonId);
        else if (customButton == detectedEscapeButton)
            options->setEscapeButton(buttonId);
    }

    if (checkbox)
        options->setCheckBox(checkbox->text(), checkbox->checkState());
}